

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.h
# Opt level: O1

bool __thiscall Sphere::intersect(Sphere *this,Ray *ray,Hit *h,float tmin)

{
  undefined8 uVar1;
  bool bVar2;
  long lVar3;
  float *pfVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  float __tmp;
  float s [2];
  Vector3f norm;
  Vector3f p;
  float local_80;
  float local_7c;
  undefined1 local_78 [16];
  float local_64;
  Vector3f local_60;
  Vector3f local_54;
  Vector3f local_48;
  Vector3f local_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_64 = tmin;
  operator-(&ray->o,&this->o);
  auVar9._0_4_ = Vector3f::squaredLength(&local_3c);
  auVar9._4_60_ = extraout_var;
  auVar6 = vfnmadd213ss_fma(ZEXT416((uint)this->r),ZEXT416((uint)this->r),auVar9._0_16_);
  fVar7 = Vector3f::dot(&local_3c,&ray->d);
  local_78 = ZEXT416((uint)(fVar7 + fVar7));
  fVar7 = Vector3f::squaredLength(&ray->d);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * -4.0 * auVar6._0_4_)),local_78,local_78);
  fVar8 = auVar6._0_4_;
  if (0.0 <= fVar8) {
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      auVar6 = vsqrtss_avx(auVar6,auVar6);
      fVar8 = auVar6._0_4_;
    }
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(local_78,auVar6);
    local_80 = (auVar6._0_4_ - fVar8) / (fVar7 + fVar7);
    fVar7 = (fVar8 - local_78._0_4_) / (fVar7 + fVar7);
    local_7c = fVar7;
    if (fVar7 < local_80) {
      local_7c = local_80;
      local_80 = fVar7;
    }
    if ((local_80 < local_64) || (bVar5 = true, h->t <= local_80)) {
      lVar3 = 0;
      do {
        bVar5 = lVar3 != 4;
        if (lVar3 == 4) {
          return bVar5;
        }
        local_80 = *(float *)(local_78 + lVar3 + -4);
        lVar3 = lVar3 + 4;
      } while ((local_80 < local_64) || (h->t <= local_80));
    }
    local_78._0_4_ = local_80;
    ::operator*(&local_60,local_80);
    operator+(&ray->o,&local_60);
    operator-(&local_54,&this->o);
    Vector3f::normalize(&local_48);
    h->t = (float)local_78._0_4_;
    h->obj = &this->super_Object;
    Vector3f::operator=(&h->norm,&local_48);
    pfVar4 = Vector3f::operator[](&local_48,2);
    local_78._0_4_ = *pfVar4;
    pfVar4 = Vector3f::operator[](&local_48,0);
    auVar10._0_4_ = atan2f((float)local_78._0_4_,*pfVar4);
    auVar10._4_60_ = extraout_var_00;
    uVar1 = vcmpss_avx512f(auVar10._0_16_,ZEXT816(0) << 0x40,1);
    bVar2 = (bool)((byte)uVar1 & 1);
    local_78._4_12_ = extraout_var_00._0_12_;
    local_78._0_4_ =
         (uint)bVar2 * (int)(auVar10._0_4_ + 6.2831855) + (uint)!bVar2 * (int)auVar10._0_4_;
    pfVar4 = Vector3f::operator[](&local_48,1);
    Vector2f::Vector2f((Vector2f *)&local_54,(1.0 - *pfVar4) * 0.5,(float)local_78._0_4_ / 6.2831855
                      );
    Vector2f::operator=(&h->pos,(Vector2f *)&local_54);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool intersect(const Ray& ray, Hit& h, float tmin) override {
		Vector3f p = ray.o - o;
		float C = p.squaredLength() - r * r;
		float B = 2 * Vector3f::dot(p, ray.d);
		float A = ray.d.squaredLength();
		float dt = B * B - 4 * A * C;
		if (dt < 0) return 0;
		dt = sqrt(dt);
		float s[2] = { (-B - dt) / (2 * A),(-B + dt) / (2 * A) };
		if (s[0] > s[1]) std::swap(s[0], s[1]);
		for (float t : s)
		{
			if (t < tmin || t >= h.t) continue;
			Vector3f norm = ray.o + ray.d * t - o;
			norm.normalize();
			h.t = t; h.obj = this; h.norm = norm;
			float u = atan2f(norm[2], norm[0]);
			if (u < 0) u += PI * 2;
			h.pos = Vector2f((-norm[1] + 1) / 2, u / (PI * 2));
			return 1;
		}
		return 0;
	}